

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

const_local_iterator * __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::end(const_local_iterator *__return_storage_ptr__,
     dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
     *this,size_type i)

{
  pointer ppVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  
  ppVar5 = this->table;
  ppVar1 = ppVar5 + i + 1;
  __return_storage_ptr__->ht = this;
  __return_storage_ptr__->pos = ppVar5 + i;
  __return_storage_ptr__->end = ppVar1;
  iVar2 = ppVar1[-1].first;
  iVar3 = (this->key_info).super_TransparentHasher.super_Hasher.num_compares_;
  iVar4 = (this->key_info).empty_key.first;
  (this->key_info).super_TransparentHasher.super_Hasher.num_compares_ = iVar3 + 1;
  if ((iVar4 != -iVar2) &&
     ((this->num_deleted == 0 ||
      (iVar4 = (this->key_info).delkey.first,
      (this->key_info).super_TransparentHasher.super_Hasher.num_compares_ = iVar3 + 2,
      iVar4 != -iVar2)))) {
    __return_storage_ptr__->pos = ppVar1;
    dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_empty_and_deleted(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const_local_iterator end(size_type i) const {
    const_local_iterator it = begin(i);
    if (!test_empty(i) && !test_deleted(i)) ++it;
    return it;
  }